

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListTest_splice_list_Test::TestBody(IntrusiveListTest_splice_list_Test *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *data_values_00;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *data_values_01;
  vector<int,_std::allocator<int>_> *expected_01;
  vector<int,_std::allocator<int>_> *expected_02;
  vector<int,_std::allocator<int>_> *data_values_02;
  vector<int,_std::allocator<int>_> *expected_03;
  vector<int,_std::allocator<int>_> *expected_04;
  int iVar4;
  TestObjectList list4;
  TestObjectList list3;
  TestObjectList list1;
  TestObjectList list2;
  int iVar5;
  undefined1 local_c8 [16];
  size_t local_b8;
  undefined1 local_a8 [16];
  size_t local_98;
  TestObjectList local_88;
  TestObjectList local_68;
  TestObject *local_48;
  TestObject *pTStack_40;
  TestObject *local_38;
  
  local_38 = (TestObject *)0x0;
  local_48 = (TestObject *)0x0;
  pTStack_40 = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0xc);
  pTStack_40 = (TestObject *)
               ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_
               + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_200000001;
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 3;
  local_48 = pTVar2;
  local_38 = pTStack_40;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::NewList
            (&local_68,(IntrusiveListTest *)&local_48,data_values);
  operator_delete(pTVar2,0xc);
  local_98 = 0;
  local_a8._0_8_ = (TestObject *)0x0;
  local_a8._8_8_ =
       (_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x0;
  pTVar2 = (TestObject *)operator_new(8);
  local_a8._8_8_ = &(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  local_a8._0_8_ = pTVar2;
  local_98 = local_a8._8_8_;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::NewList
            ((TestObjectList *)&local_48,(IntrusiveListTest *)local_a8,data_values_00);
  operator_delete(pTVar2,8);
  local_a8._8_8_ =
       (_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x0;
  iVar5 = (int)(TestObject *)&local_48;
  iVar4 = (int)&local_68;
  local_a8._0_8_ = (TestObject *)&local_48;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_68,iVar4,(__off64_t *)local_68.first_,iVar5,(__off64_t *)&local_48,
             (size_t)local_48,iVar5);
  local_98 = 0;
  local_a8._0_8_ = (TestObject *)0x0;
  local_a8._8_8_ =
       (_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x0;
  pTVar2 = (TestObject *)operator_new(0x14);
  local_a8._8_8_ = &pTVar2->data2;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
       (TestObject *)&DAT_200000001;
  pTVar2->data = 3;
  local_a8._0_8_ = pTVar2;
  local_98 = local_a8._8_8_;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_68,(TestObjectList *)local_a8,expected);
  operator_delete(pTVar2,0x14);
  local_98 = 0;
  local_a8._0_8_ = (TestObject *)0x0;
  local_a8._8_8_ =
       (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x0;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_48,(TestObjectList *)local_a8,expected_00);
  local_b8 = 0;
  local_c8._0_8_ = (TestObject *)0x0;
  local_c8._8_8_ =
       (_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x0;
  pTVar2 = (TestObject *)operator_new(0xc);
  local_c8._8_8_ =
       (long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_258000001f4;
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 700
  ;
  local_c8._0_8_ = pTVar2;
  local_b8 = local_c8._8_8_;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::NewList
            ((TestObjectList *)local_a8,(IntrusiveListTest *)local_c8,data_values_01);
  operator_delete(pTVar2,0xc);
  local_c8._8_8_ =
       (_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x0;
  iVar5 = (int)(TestObject *)local_a8;
  local_c8._0_8_ = (TestObject *)local_a8;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_68,iVar4,(__off64_t *)0x0,iVar5,(__off64_t *)local_a8,local_a8._0_8_,iVar5);
  local_b8 = 0;
  local_c8._0_8_ = (TestObject *)0x0;
  local_c8._8_8_ =
       (_Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x0;
  pTVar2 = (TestObject *)operator_new(0x20);
  local_c8._8_8_ = pTVar2 + 1;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
       (TestObject *)&DAT_200000001;
  pTVar2->data = 3;
  pTVar2->data2 = 500;
  *(undefined8 *)&pTVar2->moved = 0x2bc00000258;
  local_c8._0_8_ = pTVar2;
  local_b8 = local_c8._8_8_;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_68,(TestObjectList *)local_c8,expected_01);
  operator_delete(pTVar2,0x20);
  local_b8 = 0;
  local_c8._0_8_ = (TestObject *)0x0;
  local_c8._8_8_ =
       (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
        )0x0;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)local_a8,(TestObjectList *)local_c8,expected_02);
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(4);
  local_88.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ + 4);
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = 400
  ;
  local_88.first_ = pTVar2;
  local_88.size_ = (size_t)local_88.last_;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::NewList
            ((TestObjectList *)local_c8,(IntrusiveListTest *)&local_88,data_values_02);
  operator_delete(pTVar2,4);
  lVar3 = -4;
  pTVar2 = local_68.first_;
  do {
    if (pTVar2 == (TestObject *)0x0) {
      __assert_fail("node_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                    ,0xa3,
                    "iterator &wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator++() [T = (anonymous namespace)::TestObject]"
                   );
    }
    pTVar2 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  local_88.last_ = (TestObject *)0x0;
  iVar4 = (int)(TestObject *)local_c8;
  local_88.first_ = (TestObject *)local_c8;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_68,(int)&local_68,(__off64_t *)pTVar2,iVar4,(__off64_t *)local_c8,local_c8._0_8_
             ,iVar4);
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0x24);
  local_88.last_ =
       (TestObject *)
       ((long)&pTVar2[1].super_intrusive_list_base<(anonymous_namespace)::TestObject>.next_ + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
       (TestObject *)&DAT_200000001;
  pTVar2->data = 400;
  pTVar2->data2 = 3;
  *(undefined1 **)&pTVar2->moved = &DAT_258000001f4;
  *(undefined4 *)&pTVar2[1].super_intrusive_list_base<(anonymous_namespace)::TestObject>.next_ = 700
  ;
  local_88.first_ = pTVar2;
  local_88.size_ = (size_t)local_88.last_;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_68,&local_88,expected_03);
  operator_delete(pTVar2,0x24);
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  anon_unknown.dwarf_80ed5::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)local_c8,&local_88,expected_04);
  pTVar2 = (TestObject *)local_c8._0_8_;
  while (pTVar1 = (TestObject *)local_a8._0_8_, pTVar2 != (TestObject *)0x0) {
    if (pTVar2->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar2,0x20);
    pTVar2 = pTVar1;
  }
  while (pTVar2 = local_48, pTVar1 != (TestObject *)0x0) {
    if (pTVar1->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar2 = (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar1,0x20);
    pTVar1 = pTVar2;
  }
  while (pTVar2 != (TestObject *)0x0) {
    if (pTVar2->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar2,0x20);
    pTVar2 = pTVar1;
  }
  while (local_68.first_ != (TestObject *)0x0) {
    if ((local_68.first_)->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar2 = ((local_68.first_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_
    ;
    operator_delete(local_68.first_,0x20);
    local_68.first_ = pTVar2;
  }
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_list) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200});
  list1.splice(list1.begin(), list2);
  AssertListEq(list1, {100, 200, 1, 2, 3});
  AssertListEq(list2, {});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3);
  AssertListEq(list1, {100, 200, 1, 2, 3, 500, 600, 700});
  AssertListEq(list3, {});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 4), list4);
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 500, 600, 700});
  AssertListEq(list4, {});
}